

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
  *this_00;
  Fad<double> *pFVar8;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar9;
  double *pdVar10;
  value_type vVar11;
  
  this_00 = &this->right_->fadexpr_;
  pFVar8 = (this->left_->fadexpr_).right_;
  pdVar10 = &pFVar8->defaultVal;
  if ((pFVar8->dx_).num_elts != 0) {
    pdVar10 = (pFVar8->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar10;
  dVar2 = (this->left_->fadexpr_).left_.constant_;
  pFVar9 = (this_00->left_->fadexpr_).left_;
  dVar3 = (pFVar9->fadexpr_).left_.constant_;
  dVar4 = ((pFVar9->fadexpr_).right_)->val_;
  dVar5 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar6 = ((this_00->right_->fadexpr_).left_)->val_;
  dVar7 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar11 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
           ::dx(this_00,i);
  return vVar11 * (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ +
         (dVar6 * dVar7 + dVar3 * dVar4 * dVar5) * dVar1 * dVar2;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}